

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet6_address.cpp
# Opt level: O2

string * __thiscall
sockpp::inet6_address::to_string_abi_cxx11_(string *__return_storage_ptr__,inet6_address *this)

{
  ushort uVar1;
  char *pcVar2;
  char *__s;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char buf [46];
  
  pcVar2 = inet_ntop(10,&(this->addr_).sin6_addr,buf,0x2e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"[",&local_e9);
  __s = "<unknown>";
  if (pcVar2 != (char *)0x0) {
    __s = pcVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,__s,&local_ea);
  std::operator+(&local_88,&local_a8,&local_c8);
  std::operator+(&local_68,&local_88,"]:");
  uVar1 = (this->addr_).sin6_port;
  std::__cxx11::to_string(&local_e8,(uint)(ushort)(uVar1 << 8 | uVar1 >> 8));
  std::operator+(__return_storage_ptr__,&local_68,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

string inet6_address::to_string() const {
    char buf[INET6_ADDRSTRLEN];
    auto str = inet_ntop(AF_INET6, (void*)&(addr_.sin6_addr), buf, INET6_ADDRSTRLEN);
    return string("[") + string(str ? str : "<unknown>") +
           "]:" + std::to_string(unsigned(port()));
}